

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kparser.h
# Opt level: O0

void __thiscall KParser::addCode(KParser *this,string *op,string *opr1,string *opr2)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  string *local_f0;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c5 [13];
  string *local_b8;
  string local_b0 [32];
  string local_90 [32];
  string local_70 [32];
  iterator local_50;
  size_type local_48;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_40;
  string *local_28;
  string *opr2_local;
  string *opr1_local;
  string *op_local;
  KParser *this_local;
  
  local_b8 = local_b0;
  local_28 = opr2;
  opr2_local = opr1;
  opr1_local = op;
  op_local = (string *)this;
  std::__cxx11::string::string(local_b8,(string *)op);
  local_b8 = local_90;
  std::__cxx11::string::string(local_b8,(string *)opr1);
  local_b8 = local_70;
  std::__cxx11::string::string(local_b8,(string *)opr2);
  local_50 = (iterator)local_b0;
  local_48 = 3;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(local_c5);
  __l._M_len = local_48;
  __l._M_array = local_50;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_40,__l,local_c5);
  std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::push_back(&this->m_codes,&local_40);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_40);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(local_c5);
  local_f0 = (string *)&local_50;
  do {
    local_f0 = local_f0 + -0x20;
    std::__cxx11::string::~string(local_f0);
  } while (local_f0 != local_b0);
  return;
}

Assistant:

void addCode(std::string op, std::string opr1, std::string opr2) {
            m_codes.push_back(
                {op, opr1, opr2} 
                );
        }